

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O2

FieldDecorationsIter __thiscall
spvtools::val::ValidationState_t::id_member_decorations
          (ValidationState_t *this,uint32_t id,uint32_t member_index)

{
  _Rb_tree<spvtools::val::Decoration,_spvtools::val::Decoration,_std::_Identity<spvtools::val::Decoration>,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this_00;
  const_iterator cVar1;
  FieldDecorationsIter FVar2;
  Decoration max_decoration;
  Decoration min_decoration;
  uint32_t local_9c;
  key_type local_98;
  key_type local_70;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_9c = id;
  this_00 = &std::
             map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
             ::operator[](&this->id_decorations_,&local_9c)->_M_t;
  local_98.dec_type_ = DecorationRelaxedPrecision;
  local_98._4_4_ = 0;
  local_98.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.dec_type_ = DecorationRelaxedPrecision;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_70.params_,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98);
  local_70.struct_member_index_ = member_index;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.dec_type_ = DecorationMax;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98.params_,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  local_98.struct_member_index_ = member_index;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  FVar2.begin._M_node =
       std::
       _Rb_tree<spvtools::val::Decoration,_spvtools::val::Decoration,_std::_Identity<spvtools::val::Decoration>,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
       ::lower_bound(this_00,&local_70);
  cVar1 = std::
          _Rb_tree<spvtools::val::Decoration,_spvtools::val::Decoration,_std::_Identity<spvtools::val::Decoration>,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
          ::upper_bound(this_00,&local_98);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&local_98.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&local_70.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  FVar2.end._M_node = cVar1._M_node;
  return FVar2;
}

Assistant:

FieldDecorationsIter id_member_decorations(uint32_t id,
                                             uint32_t member_index) {
    const auto& decorations = id_decorations_[id];

    // The decorations are sorted by member_index, so this look up will give the
    // exact range of decorations for this member index.
    Decoration min_decoration((spv::Decoration)0, {}, member_index);
    Decoration max_decoration(spv::Decoration::Max, {}, member_index);

    FieldDecorationsIter result;
    result.begin = decorations.lower_bound(min_decoration);
    result.end = decorations.upper_bound(max_decoration);

    return result;
  }